

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O1

EStatusCodeAndObjectIDTypeList * __thiscall
PDFDocumentHandler::CreateFormXObjectsFromPDF
          (EStatusCodeAndObjectIDTypeList *__return_storage_ptr__,PDFDocumentHandler *this,
          IByteReaderWithPosition *inPDFStream,PDFParsingOptions *inParsingOptions,
          PDFPageRange *inPageRange,IPageEmbedInFormCommand *inPageEmbedCommand,
          double *inTransformationMatrix,ObjectIDTypeList *inCopyAdditionalObjects,
          ObjectIDTypeList *inPredefinedFormIDs)

{
  EStatusCode EVar1;
  
  EVar1 = StartCopyingContext(this,inPDFStream,inParsingOptions);
  if (EVar1 == eSuccess) {
    CreateFormXObjectsFromPDFInContext
              (__return_storage_ptr__,this,inPageRange,inPageEmbedCommand,inTransformationMatrix,
               inCopyAdditionalObjects,inPredefinedFormIDs);
  }
  else {
    __return_storage_ptr__->first = eFailure;
    (__return_storage_ptr__->second).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>
    ._M_impl._M_node._M_size = 0;
    (__return_storage_ptr__->second).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         (_List_node_base *)&__return_storage_ptr__->second;
    (__return_storage_ptr__->second).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)&__return_storage_ptr__->second;
  }
  return __return_storage_ptr__;
}

Assistant:

EStatusCodeAndObjectIDTypeList PDFDocumentHandler::CreateFormXObjectsFromPDF(	IByteReaderWithPosition* inPDFStream,
																				const PDFParsingOptions& inParsingOptions,
																					const PDFPageRange& inPageRange,
																				IPageEmbedInFormCommand* inPageEmbedCommand,
																				const double* inTransformationMatrix,
																				const ObjectIDTypeList& inCopyAdditionalObjects,
																				const ObjectIDTypeList& inPredefinedFormIDs)
{
	if(StartStreamCopyingContext(inPDFStream, inParsingOptions) != PDFHummus::eSuccess)
		return EStatusCodeAndObjectIDTypeList(PDFHummus::eFailure,ObjectIDTypeList());

	return CreateFormXObjectsFromPDFInContext(inPageRange,inPageEmbedCommand,inTransformationMatrix,inCopyAdditionalObjects, inPredefinedFormIDs);
}